

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O1

yajl_status yajl_do_parse(yajl_handle hand,uchar *jsonText,size_t jsonTextLen)

{
  size_t *offset;
  size_t *psVar1;
  uchar uVar2;
  yajl_callbacks *pyVar3;
  _func_int_void_ptr_int *p_Var4;
  yajl_alloc_funcs *pyVar5;
  bool bVar6;
  yajl_tok yVar7;
  int iVar8;
  size_t sVar9;
  _func_int_void_ptr_uchar_ptr_size_t *p_Var10;
  char *pcVar11;
  _func_int_void_ptr *p_Var12;
  int *piVar13;
  longlong lVar14;
  uchar *puVar15;
  uchar uVar16;
  uchar uVar17;
  double dVar18;
  size_t bufLen;
  uchar *buf;
  yajl_status local_5c;
  size_t local_58;
  uchar *local_50;
  uchar *local_48;
  int *local_40;
  uchar *local_38;
  
  offset = &hand->bytesConsumed;
  hand->bytesConsumed = 0;
  local_48 = jsonText;
  do {
    puVar15 = (hand->stateStack).stack;
    sVar9 = (hand->stateStack).used;
    switch(puVar15[sVar9 - 1]) {
    case '\0':
    case '\x06':
    case '\t':
    case '\v':
    case '\f':
      yVar7 = yajl_lex_lex(hand->lexer,jsonText,jsonTextLen,offset,&local_50,&local_58);
      switch(yVar7) {
      case yajl_tok_bool:
        if ((hand->callbacks == (yajl_callbacks *)0x0) ||
           (p_Var4 = hand->callbacks->yajl_boolean, p_Var4 == (_func_int_void_ptr_int *)0x0)) break;
        iVar8 = (*p_Var4)(hand->ctx,(uint)(*local_50 == 't'));
LAB_001047cc:
        if (iVar8 == 0) goto LAB_0010480f;
        uVar17 = '\0';
        bVar6 = true;
        goto LAB_001049aa;
      case yajl_tok_colon:
      case yajl_tok_comma:
      case yajl_tok_right_bracket:
switchD_001042f2_caseD_1:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        pcVar11 = "unallowed token at this point in JSON text";
        goto LAB_001047ee;
      case yajl_tok_eof:
        local_5c = yajl_status_ok;
        iVar8 = 1;
        goto LAB_00104a1a;
      case yajl_tok_error:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x03';
        goto LAB_001047f2;
      case yajl_tok_left_brace:
        uVar17 = '\t';
        if (hand->callbacks != (yajl_callbacks *)0x0) {
          p_Var12 = hand->callbacks->yajl_start_array;
LAB_00104763:
          if ((p_Var12 != (_func_int_void_ptr *)0x0) && (iVar8 = (*p_Var12)(hand->ctx), iVar8 == 0))
          {
            (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
            hand->parseError = "client cancelled parse via callback return value";
            iVar8 = 1;
            local_5c = yajl_status_client_canceled;
            jsonText = local_48;
            goto LAB_00104a1a;
          }
        }
        goto LAB_00104776;
      case yajl_tok_left_bracket:
        uVar17 = '\x04';
        if (hand->callbacks != (yajl_callbacks *)0x0) {
          p_Var12 = hand->callbacks->yajl_start_map;
          goto LAB_00104763;
        }
LAB_00104776:
        bVar6 = false;
        goto LAB_001049aa;
      case yajl_tok_null:
        if ((hand->callbacks != (yajl_callbacks *)0x0) &&
           (p_Var12 = hand->callbacks->yajl_null, p_Var12 != (_func_int_void_ptr *)0x0)) {
          iVar8 = (*p_Var12)(hand->ctx);
          goto LAB_001047cc;
        }
        break;
      case yajl_tok_right_brace:
        if ((hand->stateStack).stack[(hand->stateStack).used - 1] != '\t')
        goto switchD_001042f2_caseD_1;
        if (((hand->callbacks == (yajl_callbacks *)0x0) ||
            (p_Var12 = hand->callbacks->yajl_end_array, p_Var12 == (_func_int_void_ptr *)0x0)) ||
           (iVar8 = (*p_Var12)(hand->ctx), iVar8 != 0)) {
          psVar1 = &(hand->stateStack).used;
          *psVar1 = *psVar1 - 1;
          goto LAB_001047f2;
        }
LAB_0010480f:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        hand->parseError = "client cancelled parse via callback return value";
        iVar8 = 1;
        local_5c = yajl_status_client_canceled;
        goto LAB_00104a1a;
      case yajl_tok_integer:
        pyVar3 = hand->callbacks;
        if (pyVar3 != (yajl_callbacks *)0x0) {
          p_Var10 = (_func_int_void_ptr_uchar_ptr_size_t *)pyVar3->yajl_number;
          if (p_Var10 != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_00104799;
          if (pyVar3->yajl_integer != (_func_int_void_ptr_longlong *)0x0) {
            piVar13 = __errno_location();
            *piVar13 = 0;
            lVar14 = yajl_parse_integer(local_50,(uint)local_58);
            if ((lVar14 + 0x8000000000000001U < 2) && (*piVar13 == 0x22)) {
              (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
              pcVar11 = "integer overflow";
              goto LAB_00104931;
            }
            iVar8 = (*hand->callbacks->yajl_integer)(hand->ctx,lVar14);
LAB_0010496e:
            if (iVar8 == 0) {
              (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
              hand->parseError = "client cancelled parse via callback return value";
              iVar8 = 1;
              bVar6 = false;
              local_5c = yajl_status_client_canceled;
            }
            else {
              iVar8 = 0;
              bVar6 = true;
            }
LAB_001049a1:
            if (!bVar6) goto LAB_00104a1a;
          }
        }
        break;
      case yajl_tok_double:
        pyVar3 = hand->callbacks;
        if (pyVar3 != (yajl_callbacks *)0x0) {
          p_Var10 = (_func_int_void_ptr_uchar_ptr_size_t *)pyVar3->yajl_number;
          if (p_Var10 != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_00104799;
          if (pyVar3->yajl_double != (_func_int_void_ptr_double *)0x0) {
            yajl_buf_clear(hand->decodeBuf);
            yajl_buf_append(hand->decodeBuf,local_50,local_58);
            puVar15 = yajl_buf_data(hand->decodeBuf);
            local_50 = puVar15;
            local_40 = __errno_location();
            *local_40 = 0;
            dVar18 = strtod((char *)puVar15,(char **)0x0);
            if ((ABS(dVar18) != INFINITY) || (*local_40 != 0x22)) {
              iVar8 = (*hand->callbacks->yajl_double)(hand->ctx,dVar18);
              goto LAB_0010496e;
            }
            (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
            pcVar11 = "numeric (floating point) overflow";
LAB_00104931:
            hand->parseError = pcVar11;
            bVar6 = false;
            sVar9 = 0;
            if (local_58 <= hand->bytesConsumed) {
              sVar9 = hand->bytesConsumed - local_58;
            }
            hand->bytesConsumed = sVar9;
            iVar8 = 2;
            goto LAB_001049a1;
          }
        }
        break;
      case yajl_tok_string:
        if ((hand->callbacks != (yajl_callbacks *)0x0) &&
           (p_Var10 = hand->callbacks->yajl_string,
           p_Var10 != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) {
LAB_00104799:
          iVar8 = (*p_Var10)(hand->ctx,local_50,local_58);
          goto LAB_001047cc;
        }
        break;
      case yajl_tok_string_with_escapes:
        if ((hand->callbacks != (yajl_callbacks *)0x0) &&
           (hand->callbacks->yajl_string != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) {
          yajl_buf_clear(hand->decodeBuf);
          yajl_string_decode(hand->decodeBuf,local_50,local_58);
          local_40 = (int *)hand->ctx;
          p_Var10 = hand->callbacks->yajl_string;
          local_38 = yajl_buf_data(hand->decodeBuf);
          sVar9 = yajl_buf_len(hand->decodeBuf);
          iVar8 = (*p_Var10)(local_40,local_38,sVar9);
          goto LAB_001047cc;
        }
        break;
      default:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        pcVar11 = "invalid token, internal error";
LAB_001047ee:
        hand->parseError = pcVar11;
LAB_001047f2:
        iVar8 = 2;
        goto LAB_00104a1a;
      }
      bVar6 = true;
      uVar17 = '\0';
LAB_001049aa:
      puVar15 = (hand->stateStack).stack;
      sVar9 = (hand->stateStack).used;
      uVar2 = puVar15[sVar9 - 1];
      uVar16 = '\x01';
      if ((uVar2 != '\0') && (uVar2 != '\f')) {
        if (uVar2 == '\x06') {
          uVar16 = '\a';
        }
        else {
          uVar16 = '\n';
        }
      }
      puVar15[sVar9 - 1] = uVar16;
      iVar8 = 2;
      jsonText = local_48;
      if (!bVar6) {
        sVar9 = (hand->stateStack).size;
        if (sVar9 == (hand->stateStack).used) {
          sVar9 = sVar9 + 0x80;
          (hand->stateStack).size = sVar9;
          pyVar5 = (hand->stateStack).yaf;
          puVar15 = (uchar *)(*pyVar5->realloc)(pyVar5->ctx,(hand->stateStack).stack,sVar9);
          (hand->stateStack).stack = puVar15;
        }
        sVar9 = (hand->stateStack).used;
        (hand->stateStack).used = sVar9 + 1;
        (hand->stateStack).stack[sVar9] = uVar17;
        jsonText = local_48;
      }
LAB_00104a1a:
      if (iVar8 != 2) {
        return local_5c;
      }
      break;
    case '\x01':
      if ((hand->flags & 8) == 0) {
        if ((hand->flags & 4) != 0) {
          return yajl_status_ok;
        }
        if (*offset == jsonTextLen) {
          return yajl_status_ok;
        }
        yVar7 = yajl_lex_lex(hand->lexer,jsonText,jsonTextLen,offset,&local_50,&local_58);
        if (yVar7 != yajl_tok_eof) {
          (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
          hand->parseError = "trailing garbage";
        }
      }
      else {
        puVar15[sVar9 - 1] = '\f';
      }
      break;
    case '\x02':
    case '\x03':
      return yajl_status_error;
    case '\x04':
    case '\b':
      yVar7 = yajl_lex_lex(hand->lexer,jsonText,jsonTextLen,offset,&local_50,&local_58);
      switch(yVar7) {
      case yajl_tok_eof:
LAB_00104a57:
        return yajl_status_ok;
      case yajl_tok_error:
        goto switchD_00104456_caseD_4;
      case yajl_tok_right_bracket:
        if ((hand->stateStack).stack[(hand->stateStack).used - 1] == '\x04')
        goto switchD_0010449e_caseD_9;
      default:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        hand->parseError = "invalid object key (must be a string)";
        break;
      case yajl_tok_string_with_escapes:
        if ((hand->callbacks != (yajl_callbacks *)0x0) &&
           (hand->callbacks->yajl_map_key != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) {
          yajl_buf_clear(hand->decodeBuf);
          yajl_string_decode(hand->decodeBuf,local_50,local_58);
          local_50 = yajl_buf_data(hand->decodeBuf);
          local_58 = yajl_buf_len(hand->decodeBuf);
        }
      case yajl_tok_string:
        if (((hand->callbacks != (yajl_callbacks *)0x0) &&
            (p_Var10 = hand->callbacks->yajl_map_key,
            p_Var10 != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) &&
           (iVar8 = (*p_Var10)(hand->ctx,local_50,local_58), iVar8 == 0)) {
LAB_00104a3a:
          (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
          hand->parseError = "client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x05';
      }
      break;
    case '\x05':
      yVar7 = yajl_lex_lex(hand->lexer,jsonText,jsonTextLen,offset,&local_50,&local_58);
      if (yVar7 == yajl_tok_colon) {
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x06';
        break;
      }
      if (yVar7 != yajl_tok_error) {
        if (yVar7 == yajl_tok_eof) {
          return yajl_status_ok;
        }
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        hand->parseError = "object key and value must be separated by a colon (\':\')";
        break;
      }
switchD_00104456_caseD_4:
      (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x03';
      break;
    case '\a':
      yVar7 = yajl_lex_lex(hand->lexer,jsonText,jsonTextLen,offset,&local_50,&local_58);
      switch(yVar7) {
      case yajl_tok_comma:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\b';
        break;
      case yajl_tok_eof:
        goto LAB_00104a57;
      case yajl_tok_error:
        goto switchD_00104456_caseD_4;
      default:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        hand->parseError = "after key and value, inside map, I expect \',\' or \'}\'";
        sVar9 = 0;
        if (local_58 <= hand->bytesConsumed) {
          sVar9 = hand->bytesConsumed - local_58;
        }
        hand->bytesConsumed = sVar9;
        break;
      case yajl_tok_right_bracket:
switchD_0010449e_caseD_9:
        if (hand->callbacks != (yajl_callbacks *)0x0) {
          p_Var12 = hand->callbacks->yajl_end_map;
LAB_00104846:
          if ((p_Var12 != (_func_int_void_ptr *)0x0) && (iVar8 = (*p_Var12)(hand->ctx), iVar8 == 0))
          goto LAB_00104a3a;
        }
LAB_00104859:
        psVar1 = &(hand->stateStack).used;
        *psVar1 = *psVar1 - 1;
        break;
      }
    case '\n':
      yVar7 = yajl_lex_lex(hand->lexer,jsonText,jsonTextLen,offset,&local_50,&local_58);
      switch(yVar7) {
      case yajl_tok_comma:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\v';
        break;
      case yajl_tok_eof:
        goto LAB_00104a57;
      case yajl_tok_error:
        goto switchD_00104456_caseD_4;
      default:
        (hand->stateStack).stack[(hand->stateStack).used - 1] = '\x02';
        hand->parseError = "after array element, I expect \',\' or \']\'";
        break;
      case yajl_tok_right_brace:
        if (hand->callbacks != (yajl_callbacks *)0x0) {
          p_Var12 = hand->callbacks->yajl_end_array;
          goto LAB_00104846;
        }
        goto LAB_00104859;
      }
    default:
      abort();
    }
  } while( true );
}

Assistant:

yajl_status
yajl_do_parse(yajl_handle hand, const unsigned char * jsonText,
              size_t jsonTextLen)
{
    yajl_tok tok;
    const unsigned char * buf;
    size_t bufLen;
    size_t * offset = &(hand->bytesConsumed);

    *offset = 0;

  around_again:
    switch (yajl_bs_current(hand->stateStack)) {
        case yajl_state_parse_complete:
            if (hand->flags & yajl_allow_multiple_values) {
                yajl_bs_set(hand->stateStack, yajl_state_got_value);
                goto around_again;
            }
            if (!(hand->flags & yajl_allow_trailing_garbage)) {
                if (*offset != jsonTextLen) {
                    tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                                       offset, &buf, &bufLen);
                    if (tok != yajl_tok_eof) {
                        yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                        hand->parseError = "trailing garbage";
                    }
                    goto around_again;
                }
            }
            return yajl_status_ok;
        case yajl_state_lexical_error:
        case yajl_state_parse_error:
            return yajl_status_error;
        case yajl_state_start:
        case yajl_state_got_value:
        case yajl_state_map_need_val:
        case yajl_state_array_need_val:
        case yajl_state_array_start:  {
            /* for arrays and maps, we advance the state for this
             * depth, then push the state of the next depth.
             * If an error occurs during the parsing of the nesting
             * enitity, the state at this level will not matter.
             * a state that needs pushing will be anything other
             * than state_start */

            yajl_state stateToPush = yajl_state_start;

            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);

            switch (tok) {
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                case yajl_tok_string:
                    if (hand->callbacks && hand->callbacks->yajl_string) {
                        _CC_CHK(hand->callbacks->yajl_string(hand->ctx,
                                                             buf, bufLen));
                    }
                    break;
                case yajl_tok_string_with_escapes:
                    if (hand->callbacks && hand->callbacks->yajl_string) {
                        yajl_buf_clear(hand->decodeBuf);
                        yajl_string_decode(hand->decodeBuf, buf, bufLen);
                        _CC_CHK(hand->callbacks->yajl_string(
                                    hand->ctx, yajl_buf_data(hand->decodeBuf),
                                    yajl_buf_len(hand->decodeBuf)));
                    }
                    break;
                case yajl_tok_bool:
                    if (hand->callbacks && hand->callbacks->yajl_boolean) {
                        _CC_CHK(hand->callbacks->yajl_boolean(hand->ctx,
                                                              *buf == 't'));
                    }
                    break;
                case yajl_tok_null:
                    if (hand->callbacks && hand->callbacks->yajl_null) {
                        _CC_CHK(hand->callbacks->yajl_null(hand->ctx));
                    }
                    break;
                case yajl_tok_left_bracket:
                    if (hand->callbacks && hand->callbacks->yajl_start_map) {
                        _CC_CHK(hand->callbacks->yajl_start_map(hand->ctx));
                    }
                    stateToPush = yajl_state_map_start;
                    break;
                case yajl_tok_left_brace:
                    if (hand->callbacks && hand->callbacks->yajl_start_array) {
                        _CC_CHK(hand->callbacks->yajl_start_array(hand->ctx));
                    }
                    stateToPush = yajl_state_array_start;
                    break;
                case yajl_tok_integer:
                    if (hand->callbacks) {
                        if (hand->callbacks->yajl_number) {
                            _CC_CHK(hand->callbacks->yajl_number(
                                        hand->ctx,(const char *) buf, bufLen));
                        } else if (hand->callbacks->yajl_integer) {
                            long long int i = 0;
                            errno = 0;
                            i = yajl_parse_integer(buf, bufLen);
                            if ((i == LLONG_MIN || i == LLONG_MAX) &&
                                errno == ERANGE)
                            {
                                yajl_bs_set(hand->stateStack,
                                            yajl_state_parse_error);
                                hand->parseError = "integer overflow" ;
                                /* try to restore error offset */
                                if (*offset >= bufLen) *offset -= bufLen;
                                else *offset = 0;
                                goto around_again;
                            }
                            _CC_CHK(hand->callbacks->yajl_integer(hand->ctx,
                                                                  i));
                        }
                    }
                    break;
                case yajl_tok_double:
                    if (hand->callbacks) {
                        if (hand->callbacks->yajl_number) {
                            _CC_CHK(hand->callbacks->yajl_number(
                                        hand->ctx, (const char *) buf, bufLen));
                        } else if (hand->callbacks->yajl_double) {
                            double d = 0.0;
                            yajl_buf_clear(hand->decodeBuf);
                            yajl_buf_append(hand->decodeBuf, buf, bufLen);
                            buf = yajl_buf_data(hand->decodeBuf);
                            errno = 0;
                            d = strtod((const char *) buf, NULL);
                            if ((d == HUGE_VAL || d == -HUGE_VAL) &&
                                errno == ERANGE)
                            {
                                yajl_bs_set(hand->stateStack,
                                            yajl_state_parse_error);
                                hand->parseError = "numeric (floating point) "
                                    "overflow";
                                /* try to restore error offset */
                                if (*offset >= bufLen) *offset -= bufLen;
                                else *offset = 0;
                                goto around_again;
                            }
                            _CC_CHK(hand->callbacks->yajl_double(hand->ctx,
                                                                 d));
                        }
                    }
                    break;
                case yajl_tok_right_brace: {
                    if (yajl_bs_current(hand->stateStack) ==
                        yajl_state_array_start)
                    {
                        if (hand->callbacks &&
                            hand->callbacks->yajl_end_array)
                        {
                            _CC_CHK(hand->callbacks->yajl_end_array(hand->ctx));
                        }
                        yajl_bs_pop(hand->stateStack);
                        goto around_again;
                    }
                    /* intentional fall-through */
                }
                case yajl_tok_colon:
                case yajl_tok_comma:
                case yajl_tok_right_bracket:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError =
                        "unallowed token at this point in JSON text";
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError = "invalid token, internal error";
                    goto around_again;
            }
            /* got a value.  transition depends on the state we're in. */
            {
                yajl_state s = yajl_bs_current(hand->stateStack);
                if (s == yajl_state_start || s == yajl_state_got_value) {
                    yajl_bs_set(hand->stateStack, yajl_state_parse_complete);
                } else if (s == yajl_state_map_need_val) {
                    yajl_bs_set(hand->stateStack, yajl_state_map_got_val);
                } else {
                    yajl_bs_set(hand->stateStack, yajl_state_array_got_val);
                }
            }
            if (stateToPush != yajl_state_start) {
                yajl_bs_push(hand->stateStack, stateToPush);
            }

            goto around_again;
        }
        case yajl_state_map_start:
        case yajl_state_map_need_key: {
            /* only difference between these two states is that in
             * start '}' is valid, whereas in need_key, we've parsed
             * a comma, and a string key _must_ follow */
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                case yajl_tok_string_with_escapes:
                    if (hand->callbacks && hand->callbacks->yajl_map_key) {
                        yajl_buf_clear(hand->decodeBuf);
                        yajl_string_decode(hand->decodeBuf, buf, bufLen);
                        buf = yajl_buf_data(hand->decodeBuf);
                        bufLen = yajl_buf_len(hand->decodeBuf);
                    }
                    /* intentional fall-through */
                case yajl_tok_string:
                    if (hand->callbacks && hand->callbacks->yajl_map_key) {
                        _CC_CHK(hand->callbacks->yajl_map_key(hand->ctx, buf,
                                                              bufLen));
                    }
                    yajl_bs_set(hand->stateStack, yajl_state_map_sep);
                    goto around_again;
                case yajl_tok_right_bracket:
                    if (yajl_bs_current(hand->stateStack) ==
                        yajl_state_map_start)
                    {
                        if (hand->callbacks && hand->callbacks->yajl_end_map) {
                            _CC_CHK(hand->callbacks->yajl_end_map(hand->ctx));
                        }
                        yajl_bs_pop(hand->stateStack);
                        goto around_again;
                    }
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError =
                        "invalid object key (must be a string)"; 
                    goto around_again;
            }
        }
        case yajl_state_map_sep: {
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_colon:
                    yajl_bs_set(hand->stateStack, yajl_state_map_need_val);
                    goto around_again;
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError = "object key and value must "
                        "be separated by a colon (':')";
                    goto around_again;
            }
        }
        case yajl_state_map_got_val: {
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_right_bracket:
                    if (hand->callbacks && hand->callbacks->yajl_end_map) {
                        _CC_CHK(hand->callbacks->yajl_end_map(hand->ctx));
                    }
                    yajl_bs_pop(hand->stateStack);
                    goto around_again;
                case yajl_tok_comma:
                    yajl_bs_set(hand->stateStack, yajl_state_map_need_key);
                    goto around_again;
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError = "after key and value, inside map, "
                                       "I expect ',' or '}'";
                    /* try to restore error offset */
                    if (*offset >= bufLen) *offset -= bufLen;
                    else *offset = 0;
                    goto around_again;
            }
        }
        case yajl_state_array_got_val: {
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_right_brace:
                    if (hand->callbacks && hand->callbacks->yajl_end_array) {
                        _CC_CHK(hand->callbacks->yajl_end_array(hand->ctx));
                    }
                    yajl_bs_pop(hand->stateStack);
                    goto around_again;
                case yajl_tok_comma:
                    yajl_bs_set(hand->stateStack, yajl_state_array_need_val);
                    goto around_again;
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError =
                        "after array element, I expect ',' or ']'";
                    goto around_again;
            }
        }
        default:
            break;
    }

    abort();
    return yajl_status_error;
}